

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object___defineGetter__(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue JVar3;
  undefined1 auVar4 [16];
  JSValue JVar5;
  int iVar6;
  JSAtom prop;
  uint uVar7;
  int64_t iVar8;
  int64_t iVar9;
  ulong uVar10;
  JSValue this_obj;
  JSValueUnion local_50;
  JSValueUnion local_40;
  
  JVar5 = *argv;
  JVar1 = (JSValueUnion)argv[1].u.ptr;
  iVar2 = argv[1].tag;
  JVar3 = *(JSValue *)&argv[1].u;
  this_obj = JS_ToObject(ctx,this_val);
  uVar10 = 6;
  if ((int)this_obj.tag != 6) {
    iVar6 = check_function(ctx,JVar3);
    if (iVar6 == 0) {
      prop = JS_ValueToAtom(ctx,JVar5);
      if (prop != 0) {
        if (magic == 0) {
          local_50.float64 = local_50.float64 & 0xffffffff00000000;
          iVar6 = 0x4d05;
          iVar9 = 3;
          iVar8 = iVar2;
          local_40 = JVar1;
        }
        else {
          local_40.float64 = local_40.float64 & 0xffffffff00000000;
          iVar6 = 0x5505;
          iVar8 = 3;
          iVar9 = iVar2;
          local_50 = JVar1;
        }
        JVar3.tag = iVar8;
        JVar3.u.ptr = local_40.ptr;
        JVar5.tag = iVar9;
        JVar5.u.ptr = local_50.ptr;
        uVar7 = JS_DefineProperty(ctx,this_obj,prop,(JSValue)(ZEXT816(3) << 0x40),JVar3,JVar5,iVar6)
        ;
        JS_FreeValue(ctx,this_obj);
        JS_FreeAtom(ctx,prop);
        uVar10 = (ulong)(uVar7 >> 0x1f) * 3 + 3;
        goto LAB_00153010;
      }
    }
    JS_FreeValue(ctx,this_obj);
  }
LAB_00153010:
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar10;
  return (JSValue)(auVar4 << 0x40);
}

Assistant:

static JSValue js_object___defineGetter__(JSContext *ctx, JSValueConst this_val,
                                          int argc, JSValueConst *argv, int magic)
{
    JSValue obj;
    JSValueConst prop, value, get, set;
    int ret, flags;
    JSAtom atom;

    prop = argv[0];
    value = argv[1];

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;

    if (check_function(ctx, value)) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL)) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    flags = JS_PROP_THROW |
        JS_PROP_HAS_ENUMERABLE | JS_PROP_ENUMERABLE |
        JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE;
    if (magic) {
        get = JS_UNDEFINED;
        set = value;
        flags |= JS_PROP_HAS_SET;
    } else {
        get = value;
        set = JS_UNDEFINED;
        flags |= JS_PROP_HAS_GET;
    }
    ret = JS_DefineProperty(ctx, obj, atom, JS_UNDEFINED, get, set, flags);
    JS_FreeValue(ctx, obj);
    JS_FreeAtom(ctx, atom);
    if (ret < 0) {
        return JS_EXCEPTION;
    } else {
        return JS_UNDEFINED;
    }
}